

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall
wasm::Literal::neI8x16(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  Type *__return_storage_ptr___00;
  Literal *pLVar1;
  bool bVar2;
  Literal *val;
  long lVar3;
  anon_union_16_5_9943fe1e_for_Literal_0 *this_00;
  undefined1 local_380 [8];
  LaneArray<16> other_lanes;
  LaneArray<16> lanes;
  anon_union_16_5_9943fe1e_for_Literal_0 local_68;
  undefined8 local_58;
  anon_union_16_5_9943fe1e_for_Literal_0 local_50;
  undefined8 local_40;
  Literal *local_38;
  
  local_38 = __return_storage_ptr__;
  getLanes<unsigned_char,16>((LaneArray<16> *)&other_lanes._M_elems[0xf].type,(wasm *)this,other);
  getLanes<unsigned_char,16>((LaneArray<16> *)local_380,(wasm *)other,val);
  lVar3 = 0;
  __return_storage_ptr___00 = &lanes._M_elems[0xf].type;
  do {
    this_00 = (anon_union_16_5_9943fe1e_for_Literal_0 *)((long)lanes._M_elems + lVar3 + -8);
    ne((Literal *)__return_storage_ptr___00,(Literal *)&this_00->func,(Literal *)(local_380 + lVar3)
      );
    local_50.i32 = 1;
    local_40 = 2;
    bVar2 = operator==((Literal *)__return_storage_ptr___00,(Literal *)&local_50.func);
    local_68.i32 = -(uint)bVar2;
    local_58 = 2;
    if (this_00 != &local_68) {
      ~Literal((Literal *)&this_00->func);
      Literal((Literal *)&this_00->func,(Literal *)&local_68.func);
    }
    ~Literal((Literal *)&local_68.func);
    ~Literal((Literal *)&local_50.func);
    ~Literal((Literal *)__return_storage_ptr___00);
    pLVar1 = local_38;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x180);
  Literal(local_38,(LaneArray<16> *)&other_lanes._M_elems[0xf].type);
  lVar3 = 0x168;
  do {
    ~Literal((Literal *)(local_380 + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  lVar3 = 0x168;
  do {
    ~Literal((Literal *)((long)lanes._M_elems + lVar3 + -8));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  return pLVar1;
}

Assistant:

Literal Literal::neI8x16(const Literal& other) const {
  return compare<16, &Literal::getLanesUI8x16, &Literal::ne>(*this, other);
}